

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

xmlLocationSetPtr xmlXPtrLocationSetMerge(xmlLocationSetPtr val1,xmlLocationSetPtr val2)

{
  long lVar1;
  
  if ((val2 != (xmlLocationSetPtr)0x0 && val1 != (xmlLocationSetPtr)0x0) && (0 < val2->locNr)) {
    lVar1 = 0;
    do {
      xmlXPtrLocationSetAdd(val1,val2->locTab[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < val2->locNr);
  }
  return val1;
}

Assistant:

xmlLocationSetPtr
xmlXPtrLocationSetMerge(xmlLocationSetPtr val1, xmlLocationSetPtr val2) {
    int i;

    if (val1 == NULL) return(NULL);
    if (val2 == NULL) return(val1);

    /*
     * !!!!! this can be optimized a lot, knowing that both
     *       val1 and val2 already have unicity of their values.
     */

    for (i = 0;i < val2->locNr;i++)
        xmlXPtrLocationSetAdd(val1, val2->locTab[i]);

    return(val1);
}